

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O1

IvVec2 * __thiscall
deqp::egl::UpdateResolutionCase::getNativePixelsPerInch
          (IvVec2 *__return_storage_ptr__,UpdateResolutionCase *this)

{
  bool *pbVar1;
  UpdateResolutionCase *pUVar2;
  Library *egl;
  long lVar3;
  Vector<tcu::Interval,_2> *res_1;
  IVec2 bufPp10km;
  IVec2 winSize;
  IVec2 bufSize;
  IVec2 winPpi;
  IvVec2 bufPpiI;
  Vector<tcu::Interval,_2> res;
  Vector<int,_2> local_280;
  Vector<int,_2> local_278;
  Vector<int,_2> local_270;
  Interval local_268;
  undefined1 local_250;
  double local_248;
  double local_240;
  Interval local_238;
  undefined1 local_220;
  double local_218;
  double local_210;
  UpdateResolutionCase *local_208;
  Interval aIStack_200 [2];
  undefined8 local_1d0;
  double dStack_1c8;
  double local_1c0;
  undefined1 local_1b8 [8];
  double dStack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  double dStack_198;
  double local_190;
  ios_base local_140 [272];
  
  egl = EglTestContext::getLibrary((this->super_ResizeTest).super_TestCase.m_eglTestCtx);
  eglu::getSurfaceSize
            ((eglu *)&local_270,egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  (*((this->super_ResizeTest).m_nativeWindow.
     super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr)->
    _vptr_NativeWindow[7])(&local_278);
  local_208 = this;
  eglu::getSurfaceResolution
            ((eglu *)&local_280,egl,(this->super_ResizeTest).m_display,
             ((this->super_ResizeTest).m_surface.
              super_UniqueBase<eglu::UniqueSurface,_de::DefaultDeleter<eglu::UniqueSurface>_>.m_data
             .ptr)->m_surface);
  approximateInt(&local_268,local_280.m_data[0]);
  approximateInt(&local_238,local_280.m_data[1]);
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)&dStack_1c8 + lVar3) = 0;
    *(undefined8 *)((long)&local_1c0 + lVar3) = 0x7ff0000000000000;
    *(undefined8 *)(local_1b8 + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x40);
  local_1a8._M_allocated_capacity = (size_type)local_268.m_hi;
  dStack_1b0 = local_268.m_lo;
  dStack_198 = local_238.m_lo;
  local_190 = local_238.m_hi;
  local_268.m_hasNaN = false;
  local_268.m_lo = 2540000.0;
  local_268.m_hi = 2540000.0;
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)&local_210 + lVar3) = 0;
    *(undefined8 *)((long)aIStack_200 + lVar3 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&aIStack_200[0].m_hasNaN + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x40);
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)&local_210 + lVar3) = 0;
    *(undefined8 *)((long)aIStack_200 + lVar3 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&aIStack_200[0].m_hasNaN + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 == 0x28);
  lVar3 = 0;
  do {
    tcu::operator/(&local_238,(Interval *)(local_1b8 + lVar3),&local_268);
    *(double *)((long)&aIStack_200[0].m_hi + lVar3) = local_238.m_hi;
    *(ulong *)(&aIStack_200[0].m_hasNaN + lVar3) = CONCAT44(local_238._4_4_,local_238._0_4_);
    *(double *)((long)&aIStack_200[0].m_lo + lVar3) = local_238.m_lo;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 == 0x18);
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)&local_248 + lVar3) = 0;
    *(undefined8 *)((long)&local_240 + lVar3) = 0x7ff0000000000000;
    *(undefined8 *)(&local_238.m_hasNaN + lVar3) = 0xfff0000000000000;
    pUVar2 = local_208;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x40);
  local_218 = (double)local_278.m_data[1];
  local_238.m_lo = (double)local_278.m_data[0];
  local_238._0_4_ = local_238._0_4_ & 0xffffff00;
  local_220 = 0;
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)&dStack_1c8 + lVar3) = 0;
    *(undefined8 *)((long)&local_1c0 + lVar3) = 0x7ff0000000000000;
    *(undefined8 *)(local_1b8 + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x40);
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)&dStack_1c8 + lVar3) = 0;
    *(undefined8 *)((long)&local_1c0 + lVar3) = 0x7ff0000000000000;
    *(undefined8 *)(local_1b8 + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 == 0x28);
  lVar3 = 0;
  local_238.m_hi = local_238.m_lo;
  local_210 = local_218;
  do {
    tcu::operator*(&local_268,(Interval *)(&local_238.m_hasNaN + lVar3),
                   (Interval *)(&aIStack_200[0].m_hasNaN + lVar3));
    *(double *)((long)&local_1a8 + lVar3) = local_268.m_hi;
    *(ulong *)(local_1b8 + lVar3) = CONCAT71(local_268._1_7_,local_268.m_hasNaN);
    *(double *)((long)&dStack_1b0 + lVar3) = local_268.m_lo;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 == 0x18);
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)local_278.m_data + lVar3) = 0;
    *(undefined8 *)((long)local_270.m_data + lVar3) = 0x7ff0000000000000;
    *(undefined8 *)(&local_268.m_hasNaN + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x40);
  local_248 = (double)local_270.m_data[1];
  local_268.m_lo = (double)local_270.m_data[0];
  local_268.m_hasNaN = false;
  local_250 = 0;
  lVar3 = 0x10;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar3 + -0x10) = 0;
    *(undefined8 *)((long)__return_storage_ptr__->m_data + lVar3 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(&__return_storage_ptr__->m_data[0].m_hasNaN + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != 0x40);
  lVar3 = 0;
  do {
    (&__return_storage_ptr__->m_data[0].m_hasNaN)[lVar3] = false;
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_lo + lVar3) = 0x7ff0000000000000;
    *(undefined8 *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar3) = 0xfff0000000000000;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 == 0x18);
  lVar3 = 0;
  local_268.m_hi = local_268.m_lo;
  local_240 = local_248;
  do {
    tcu::operator/((Interval *)&stack0xfffffffffffffe30,(Interval *)(local_1b8 + lVar3),
                   (Interval *)(&local_268.m_hasNaN + lVar3));
    *(double *)((long)&__return_storage_ptr__->m_data[0].m_hi + lVar3) = local_1c0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar3;
    *(undefined8 *)pbVar1 = local_1d0;
    *(double *)(pbVar1 + 8) = dStack_1c8;
    lVar3 = lVar3 + 0x18;
  } while (lVar3 == 0x18);
  local_238._0_4_ =
       (BADTYPE)((__return_storage_ptr__->m_data[0].m_lo + __return_storage_ptr__->m_data[0].m_hi) *
                0.5);
  local_238._4_4_ =
       (BADTYPE)((__return_storage_ptr__->m_data[1].m_lo + __return_storage_ptr__->m_data[1].m_hi) *
                0.5);
  local_1b8 = (undefined1  [8])(pUVar2->super_ResizeTest).m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_1b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&dStack_1b0,"EGL surface size: ",0x12);
  tcu::operator<<((ostream *)&dStack_1b0,&local_270);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_1b0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&dStack_1b0,"EGL surface pixel density (pixels / 10 km): ",0x2c);
  tcu::operator<<((ostream *)&dStack_1b0,&local_280);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_1b0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&dStack_1b0,"Native window size: ",0x14);
  tcu::operator<<((ostream *)&dStack_1b0,&local_278);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_1b0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&dStack_1b0,"Native pixel density (ppi): ",0x1c);
  tcu::operator<<((ostream *)&dStack_1b0,(Vector<int,_2> *)&local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_1b0,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_1b0);
  std::ios_base::~ios_base(local_140);
  local_1b8 = (undefined1  [8])&local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,
             "Surface pixel density is less than one pixel per 10 km. Is the surface really visible from space?"
             ,"");
  tcu::ResultCollector::checkResult
            (&(pUVar2->super_ResizeTest).m_status,0 < local_280.m_data[1] && 0 < local_280.m_data[0]
             ,QP_TEST_RESULT_QUALITY_WARNING,(string *)local_1b8);
  if (local_1b8 != (undefined1  [8])&local_1a8) {
    operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

IvVec2 UpdateResolutionCase::getNativePixelsPerInch	(void)
{
	const Library&	egl			= m_eglTestCtx.getLibrary();
	const int		inchPer10km	= 254 * EGL_DISPLAY_SCALING;
	const IVec2		bufSize		= eglu::getSurfaceSize(egl, m_display, **m_surface);
	const IVec2		winSize		= m_nativeWindow->getScreenSize();
	const IVec2		bufPp10km	= eglu::getSurfaceResolution(egl, m_display, **m_surface);
	const IvVec2	bufPpiI		= (IvVec2(approximateInt(bufPp10km.x()),
										  approximateInt(bufPp10km.y()))
								   / Interval(inchPer10km));
	const IvVec2	winPpiI		= ivVec2(winSize) * bufPpiI / ivVec2(bufSize);
	const IVec2		winPpi		(int(winPpiI.x().midpoint()), int(winPpiI.y().midpoint()));

	m_log << TestLog::Message
		  << "EGL surface size: "							<< bufSize		<< "\n"
		  << "EGL surface pixel density (pixels / 10 km): "	<< bufPp10km	<< "\n"
		  << "Native window size: "							<< winSize		<< "\n"
		  << "Native pixel density (ppi): "					<< winPpi		<< "\n"
		  << TestLog::EndMessage;

	m_status.checkResult(bufPp10km.x() >= 1 && bufPp10km.y() >= 1,
						 QP_TEST_RESULT_QUALITY_WARNING,
						 "Surface pixel density is less than one pixel per 10 km. "
						 "Is the surface really visible from space?");

	return winPpiI;
}